

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3d066b::BuildEngineImpl::addTaskInputRequest
          (BuildEngineImpl *this,Task *task,KeyType *key,uintptr_t inputID,bool orderOnly,
          bool singleUse)

{
  TaskInfo *pTVar1;
  RuleInfo *pRVar2;
  value_type local_50;
  
  pTVar1 = getTaskInfo(this,task);
  if (pTVar1->forRuleInfo->state == InProgressWaiting) {
    pRVar2 = getRuleInfoForKey(this,key);
    std::mutex::lock(&this->inputRequestsMutex);
    local_50.forcePriorValue = false;
    local_50.taskInfo = pTVar1;
    local_50.inputID = inputID;
    local_50.inputRuleInfo = pRVar2;
    local_50.orderOnly = orderOnly;
    local_50.singleUse = singleUse;
    std::
    deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
    ::push_back(&this->inputRequests,&local_50);
    pTVar1->waitCount = pTVar1->waitCount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->inputRequestsMutex);
    return;
  }
  abort();
}

Assistant:

void addTaskInputRequest(Task* task, const KeyType& key, uintptr_t inputID, bool orderOnly, bool singleUse) {
    auto taskInfo = getTaskInfo(task);

    // Validate that the task is in a valid state to request inputs.
    if (!taskInfo->forRuleInfo->isInProgressWaiting()) {
      // FIXME: Error handling.
      abort();
    }

    // Lookup the rule for this task.
    RuleInfo* ruleInfo = &getRuleInfoForKey(key);

    std::lock_guard<std::mutex> guard(inputRequestsMutex);
    inputRequests.push_back({ taskInfo, inputID, ruleInfo, orderOnly, false, singleUse });
    taskInfo->waitCount++;
  }